

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_fontdef_type1.c
# Opt level: O2

HPDF_STATUS HPDF_Type1FontDef_SetWidths(HPDF_FontDef fontdef,HPDF_CharData *widths)

{
  HPDF_INT16 HVar1;
  undefined4 uVar2;
  void *pvVar3;
  int iVar4;
  void *s;
  HPDF_STATUS HVar5;
  long lVar6;
  bool bVar7;
  
  pvVar3 = fontdef->attr;
  HPDF_FreeMem(fontdef->mmgr,*(void **)((long)pvVar3 + 8));
  *(undefined8 *)((long)pvVar3 + 8) = 0;
  fontdef->valid = 0;
  iVar4 = 0;
  for (lVar6 = 0; *(short *)((long)&widths->unicode + lVar6) != -1; lVar6 = lVar6 + 6) {
    iVar4 = iVar4 + 1;
  }
  *(int *)((long)pvVar3 + 0x10) = iVar4;
  s = HPDF_GetMem(fontdef->mmgr,(HPDF_UINT)lVar6);
  if (s != (void *)0x0) {
    lVar6 = 0;
    HPDF_MemSet(s,'\0',*(int *)((long)pvVar3 + 0x10) * 6);
    *(void **)((long)pvVar3 + 8) = s;
    iVar4 = *(int *)((long)pvVar3 + 0x10);
    while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
      uVar2 = *(undefined4 *)((long)&widths->char_cd + lVar6);
      *(undefined4 *)((long)s + lVar6) = uVar2;
      HVar1 = *(HPDF_INT16 *)((long)&widths->width + lVar6);
      *(HPDF_INT16 *)((long)s + lVar6 + 4) = HVar1;
      if ((short)((uint)uVar2 >> 0x10) == 0x20) {
        fontdef->missing_width = HVar1;
      }
      lVar6 = lVar6 + 6;
    }
    return 0;
  }
  HVar5 = HPDF_Error_GetCode(fontdef->error);
  return HVar5;
}

Assistant:

HPDF_STATUS
HPDF_Type1FontDef_SetWidths  (HPDF_FontDef          fontdef,
                              const HPDF_CharData*  widths)
{
    const HPDF_CharData* src = widths;
    HPDF_Type1FontDefAttr attr = (HPDF_Type1FontDefAttr)fontdef->attr;
    HPDF_CharData* dst;
    HPDF_UINT i = 0;

    HPDF_PTRACE ((" HPDF_Type1FontDef_SetWidths\n"));

    FreeWidth (fontdef);

    while (src->unicode != 0xFFFF) {
        src++;
        i++;
    }

    attr->widths_count = i;

    dst = (HPDF_CharData*)HPDF_GetMem (fontdef->mmgr, sizeof(HPDF_CharData) *
            attr->widths_count);
    if (dst == NULL)
        return HPDF_Error_GetCode (fontdef->error);

    HPDF_MemSet (dst, 0, sizeof(HPDF_CharData) * attr->widths_count);
    attr->widths = dst;

    src = widths;
    for (i = 0; i < attr->widths_count; i++) {
        dst->char_cd = src->char_cd;
        dst->unicode = src->unicode;
        dst->width = src->width;
        if (dst->unicode == 0x0020) {
            fontdef->missing_width = src->width;
        }

        src++;
        dst++;
    }

    return HPDF_OK;
}